

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O0

void thread_start(Sched *sched,_func_void *func)

{
  int iVar1;
  _func_void *arg;
  _func_void *local_40;
  ThreadArgs args;
  Thread *hu_c_implicit_cast_val__COUNTER__;
  Thread *th;
  _func_void *func_local;
  Sched *sched_local;
  
  arg = (_func_void *)malloc(0x80);
  *(Sched **)arg = sched;
  iVar1 = sched->next_id;
  sched->next_id = iVar1 + 1;
  *(int *)(arg + 0x78) = iVar1;
  args.entry = arg;
  fiber_alloc((Fiber *)(arg + 0x18),0x4000,thread_guard,arg,8);
  local_40 = arg;
  args.thread = (Thread *)func;
  fiber_push_return((Fiber *)(arg + 0x18),thread_exec,&local_40,0x10);
  *(Thread **)(arg + 0x10) = sched->running->next;
  *(Thread **)(arg + 8) = sched->running;
  *(_func_void **)(*(long *)(arg + 0x10) + 8) = arg;
  *(_func_void **)(*(long *)(arg + 8) + 0x10) = arg;
  return;
}

Assistant:

static void
thread_start(Sched *sched, void (*func)(void))
{
    Thread *th = hu_cxx_static_cast(Thread *, malloc(sizeof *th));
    th->sched = sched;
    th->id = sched->next_id++;
    (void) fiber_alloc(
      &th->fiber, STACK_SIZE, thread_guard, th, FIBER_FLAG_GUARD_LO);

    ThreadArgs args;
    args.thread = th;
    args.entry = func;
    fiber_push_return(&th->fiber, thread_exec, &args, sizeof args);

    th->next = sched->running->next;
    th->prev = sched->running;
    th->next->prev = th;
    th->prev->next = th;
}